

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhCellWriteHeader(lhcell *pCell)

{
  sxu16 sVar1;
  uint uVar2;
  lhpage *plVar3;
  uchar *puVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  
  plVar3 = pCell->pPage;
  puVar4 = plVar3->pRaw->zData;
  uVar7 = (ulong)pCell->iStart;
  uVar2 = pCell->nHash;
  *(uint *)(puVar4 + uVar7) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = pCell->nKey;
  *(uint *)(puVar4 + uVar7 + 4) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar5 = pCell->nData;
  *(ulong *)(puVar4 + uVar7 + 8) =
       uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
       (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
       (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  sVar1 = (plVar3->sHdr).iOfft;
  pCell->iNext = sVar1;
  puVar4[uVar7 + 0x11] = (uchar)sVar1;
  puVar4[uVar7 + 0x10] = (uchar)(sVar1 >> 8);
  uVar5 = pCell->iOvfl;
  *(ulong *)(puVar4 + uVar7 + 0x12) =
       uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
       (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
       (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  uVar6 = pCell->iStart;
  (plVar3->sHdr).iOfft = uVar6;
  uVar6 = uVar6 << 8 | uVar6 >> 8;
  *(ushort *)plVar3->pRaw->zData = uVar6;
  return (int)uVar6;
}

Assistant:

static int lhCellWriteHeader(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage;
	unsigned char *zRaw = pPage->pRaw->zData;
	/* Seek to the desired location */
	zRaw += pCell->iStart;
	/* 4 byte hash number */
	SyBigEndianPack32(zRaw,pCell->nHash);
	zRaw += 4;
	/* 4 byte key length */
	SyBigEndianPack32(zRaw,pCell->nKey);
	zRaw += 4;
	/* 8 byte data length */
	SyBigEndianPack64(zRaw,pCell->nData);
	zRaw += 8;
	/* 2 byte offset of the next cell */
	pCell->iNext = pPage->sHdr.iOfft;
	SyBigEndianPack16(zRaw,pCell->iNext);
	zRaw += 2;
	/* 8 byte overflow page number */
	SyBigEndianPack64(zRaw,pCell->iOvfl);
	/* Update the page header */
	pPage->sHdr.iOfft = pCell->iStart;
	/* pEngine->pIo->xWrite() has been successfully called on this page */
	SyBigEndianPack16(pPage->pRaw->zData,pCell->iStart);
	/* All done */
	return UNQLITE_OK;
}